

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadlib.c
# Opt level: O0

int loader_C(lua_State *L)

{
  int iVar1;
  char *pcVar2;
  char *path;
  char *filename;
  char *name;
  char *funcname;
  lua_State *L_local;
  
  pcVar2 = luaL_checklstring(L,1,(size_t *)0x0);
  path = findfile(L,pcVar2,"cpath");
  if (path != (char *)0x0) {
    pcVar2 = mkfuncname(L,pcVar2);
    iVar1 = ll_loadfunc(L,path,pcVar2);
    if (iVar1 != 0) {
      loaderror(L,path);
    }
  }
  return 1;
}

Assistant:

static int loader_C (lua_State *L) {
  const char *funcname;
  const char *name = luaL_checkstring(L, 1);
  const char *filename = findfile(L, name, "cpath");
  if (filename == NULL) return 1;  /* library not found in this path */
  funcname = mkfuncname(L, name);
  if (ll_loadfunc(L, filename, funcname) != 0)
    loaderror(L, filename);
  return 1;  /* library loaded successfully */
}